

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O1

void __thiscall
tchecker::refzg::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
share(state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
      *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
            *p)

{
  ta::details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  share(&this->
         super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
        ,p);
  if (p->_t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
    hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
    ::find_else_add((hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                     *)&stack0xffffffffffffffe8,
                    (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
                     *)&(((this->_zone_cache).
                          super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->
                        super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                        )._hashtable);
    if (p->_t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
      ::operator=(&(p->_t->super_state_t)._zone,
                  (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
                   *)&stack0xffffffffffffffe8);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
                  *)&stack0xffffffffffffffe8);
      return;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::refzg::state_t>]"
               );
}

Assistant:

void share(tchecker::intrusive_shared_ptr_t<STATE> const & p)
  {
    tchecker::ta::details::state_pool_allocator_t<STATE>::share(p);
    p->zone_ptr() = _zone_cache->find_else_add(p->zone_ptr());
  }